

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mzd_additional.c
# Opt level: O3

void mzd_addmul_v_uint64_129(mzd_local_t *c,mzd_local_t *v,mzd_local_t *A)

{
  word wVar1;
  int iVar2;
  uint i;
  long lVar3;
  ulong uVar4;
  mzd_local_t *pmVar5;
  word *vptr;
  uint i_1;
  int iVar6;
  uint i_2;
  
  wVar1 = v->w64[0];
  lVar3 = 0;
  do {
    c->w64[lVar3] = c->w64[lVar3] ^ A[0x3f].w64[lVar3] & (long)wVar1 >> 0x3f;
    lVar3 = lVar3 + 1;
  } while (lVar3 != 3);
  pmVar5 = A + 0x40;
  iVar2 = 2;
  do {
    uVar4 = *(word *)((long)v + 8);
    v = (mzd_local_t *)((long)v + 8);
    iVar6 = 0x40;
    do {
      lVar3 = 0;
      do {
        c->w64[lVar3] = c->w64[lVar3] ^ pmVar5->w64[lVar3] & -(ulong)((uint)uVar4 & 1);
        lVar3 = lVar3 + 1;
      } while (lVar3 != 3);
      uVar4 = uVar4 >> 1;
      pmVar5 = pmVar5 + 1;
      iVar6 = iVar6 + -1;
    } while (iVar6 != 0);
    iVar2 = iVar2 + -1;
  } while (iVar2 != 0);
  return;
}

Assistant:

void mzd_addmul_v_uint64_129(mzd_local_t* c, mzd_local_t const* v, mzd_local_t const* A) {
  block_t* cblock       = BLOCK(c, 0);
  const word* vptr      = CONST_BLOCK(v, 0)->w64;
  const block_t* Ablock = CONST_BLOCK(A, 0);

  Ablock += 63;
  {
    word idx        = (*vptr) >> 63;
    const word mask = -(idx & 1);
    mzd_xor_mask_uint64_block(cblock, Ablock, mask, 3);
    Ablock++;
    vptr++;
  }

  for (unsigned int w = 2; w; --w, ++vptr) {
    word idx = *vptr;
    for (unsigned int i = sizeof(word) * 8; i; --i, idx >>= 1, ++Ablock) {
      const word mask = -(idx & 1);
      mzd_xor_mask_uint64_block(cblock, Ablock, mask, 3);
    }
  }
}